

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O1

void __thiscall
cbtQuantizedBvh::walkStacklessTree
          (cbtQuantizedBvh *this,cbtNodeOverlapCallback *nodeCallback,cbtVector3 *aabbMin,
          cbtVector3 *aabbMax)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  cbtOptimizedBvhNode *pcVar5;
  
  if (this->m_curNodeIndex < 1) {
    iVar3 = 0;
  }
  else {
    pcVar5 = (this->m_contiguousNodes).m_data;
    iVar4 = 0;
    iVar3 = 0;
    do {
      if (((pcVar5->m_aabbMaxOrg).m_floats[0] < aabbMin->m_floats[0]) ||
         (aabbMax->m_floats[0] < (pcVar5->m_aabbMinOrg).m_floats[0])) {
        bVar2 = false;
      }
      else {
        bVar2 = true;
      }
      if (((pcVar5->m_aabbMaxOrg).m_floats[2] < aabbMin->m_floats[2]) ||
         (aabbMax->m_floats[2] < (pcVar5->m_aabbMinOrg).m_floats[2])) {
        bVar2 = false;
      }
      if (((pcVar5->m_aabbMaxOrg).m_floats[1] < aabbMin->m_floats[1]) ||
         (aabbMax->m_floats[1] < (pcVar5->m_aabbMinOrg).m_floats[1])) {
        bVar2 = false;
      }
      iVar1 = pcVar5->m_escapeIndex;
      if ((bVar2) && (iVar1 == -1)) {
        (*nodeCallback->_vptr_cbtNodeOverlapCallback[2])
                  (nodeCallback,(ulong)(uint)pcVar5->m_subPart,(ulong)(uint)pcVar5->m_triangleIndex)
        ;
      }
      if ((bool)(~bVar2 & iVar1 != -1)) {
        iVar4 = iVar4 + pcVar5->m_escapeIndex;
        pcVar5 = pcVar5 + pcVar5->m_escapeIndex;
      }
      else {
        pcVar5 = pcVar5 + 1;
        iVar4 = iVar4 + 1;
      }
      iVar3 = iVar3 + 1;
    } while (iVar4 < this->m_curNodeIndex);
  }
  if (maxIterations < iVar3) {
    maxIterations = iVar3;
  }
  return;
}

Assistant:

void cbtQuantizedBvh::walkStacklessTree(cbtNodeOverlapCallback* nodeCallback, const cbtVector3& aabbMin, const cbtVector3& aabbMax) const
{
	cbtAssert(!m_useQuantization);

	const cbtOptimizedBvhNode* rootNode = &m_contiguousNodes[0];
	int escapeIndex, curIndex = 0;
	int walkIterations = 0;
	bool isLeafNode;
	//PCK: unsigned instead of bool
	unsigned aabbOverlap;

	while (curIndex < m_curNodeIndex)
	{
		//catch bugs in tree data
		cbtAssert(walkIterations < m_curNodeIndex);

		walkIterations++;
		aabbOverlap = TestAabbAgainstAabb2(aabbMin, aabbMax, rootNode->m_aabbMinOrg, rootNode->m_aabbMaxOrg);
		isLeafNode = rootNode->m_escapeIndex == -1;

		//PCK: unsigned instead of bool
		if (isLeafNode && (aabbOverlap != 0))
		{
			nodeCallback->processNode(rootNode->m_subPart, rootNode->m_triangleIndex);
		}

		//PCK: unsigned instead of bool
		if ((aabbOverlap != 0) || isLeafNode)
		{
			rootNode++;
			curIndex++;
		}
		else
		{
			escapeIndex = rootNode->m_escapeIndex;
			rootNode += escapeIndex;
			curIndex += escapeIndex;
		}
	}
	if (maxIterations < walkIterations)
		maxIterations = walkIterations;
}